

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point-to-point.cpp
# Opt level: O0

ssize_t diy::mpi::detail::recv(int __fd,void *__buf,size_t __n,int __flags)

{
  MPI_Datatype poVar1;
  MPI_Comm poVar2;
  MPI_Datatype *ppoVar3;
  MPI_Comm *ppoVar4;
  MPI_Status *pMVar5;
  undefined4 in_register_0000003c;
  undefined8 in_R8;
  undefined4 in_R9D;
  DIY_MPI_Datatype *in_stack_00000008;
  status *s;
  DIY_MPI_Comm local_8;
  
  local_8.data = (MPI_Comm)__buf;
  ppoVar3 = mpi_cast(in_stack_00000008);
  poVar1 = *ppoVar3;
  ppoVar4 = mpi_cast(&local_8);
  poVar2 = *ppoVar4;
  pMVar5 = mpi_cast((DIY_MPI_Status *)CONCAT44(in_register_0000003c,__fd));
  MPI_Recv(in_R8,in_R9D,poVar1,__n & 0xffffffff,__flags,poVar2,pMVar5);
  return (ssize_t)(DIY_MPI_Status *)CONCAT44(in_register_0000003c,__fd);
}

Assistant:

status recv(DIY_MPI_Comm comm, int source, int tag, void* data, int count, const datatype& type)
{
#if DIY_HAS_MPI
  status s;
  MPI_Recv(data, count, mpi_cast(type.handle), source, tag, mpi_cast(comm), &mpi_cast(s.handle));
  return s;
#else
  (void) comm; (void) source; (void) tag; (void) data; (void) count; (void) type;
  DIY_UNSUPPORTED_MPI_CALL(MPI_Recv);
#endif
}